

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

void __thiscall HighsPseudocost::increaseConflictWeight(HighsPseudocost *this)

{
  size_type sVar1;
  reference pvVar2;
  long in_RDI;
  double dVar3;
  HighsInt i;
  HighsInt numCol;
  double scale;
  undefined4 local_18;
  
  *(double *)(in_RDI + 0x120) = *(double *)(in_RDI + 0x120) * 1.02;
  if (1000.0 < *(double *)(in_RDI + 0x120)) {
    dVar3 = 1.0 / *(double *)(in_RDI + 0x120);
    *(undefined8 *)(in_RDI + 0x120) = 0x3ff0000000000000;
    *(double *)(in_RDI + 0x128) = dVar3 * *(double *)(in_RDI + 0x128);
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0));
    for (local_18 = 0; local_18 < (int)sVar1; local_18 = local_18 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0),(long)local_18)
      ;
      *pvVar2 = dVar3 * *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),(long)local_18
                         );
      *pvVar2 = dVar3 * *pvVar2;
    }
  }
  return;
}

Assistant:

void increaseConflictWeight() {
    conflict_weight *= 1.02;

    if (conflict_weight > 1000.0) {
      double scale = 1.0 / conflict_weight;
      conflict_weight = 1.0;
      conflict_avg_score *= scale;

      HighsInt numCol = conflictscoreup.size();
      for (HighsInt i = 0; i < numCol; ++i) {
        conflictscoreup[i] *= scale;
        conflictscoredown[i] *= scale;
      }
    }
  }